

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderUInt32
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,ProtoStreamObjectSource *os,
          Type *type,StringPiece field_name,ObjectWriter *ow)

{
  byte bVar1;
  CodedInputStream *pCVar2;
  byte *pbVar3;
  uint32 uVar4;
  ulong uVar5;
  
  pCVar2 = this->stream_;
  pbVar3 = pCVar2->buffer_;
  if (pbVar3 < pCVar2->buffer_end_) {
    uVar4 = (uint32)*pbVar3;
    if ((char)*pbVar3 < '\0') goto LAB_00322f54;
    pCVar2->buffer_ = pbVar3 + 1;
  }
  else {
    uVar4 = 0;
LAB_00322f54:
    uVar4 = io::CodedInputStream::ReadTagFallback(pCVar2,uVar4);
  }
  pCVar2->last_tag_ = uVar4;
  if (uVar4 == 0) {
    uVar5 = 0;
    goto LAB_00322fd8;
  }
  pCVar2 = this->stream_;
  pbVar3 = pCVar2->buffer_;
  if (pbVar3 < pCVar2->buffer_end_) {
    bVar1 = *pbVar3;
    uVar5 = (ulong)bVar1;
    uVar4 = (uint32)bVar1;
    if ((char)bVar1 < '\0') goto LAB_00322f95;
    pCVar2->buffer_ = pbVar3 + 1;
  }
  else {
    uVar4 = 0;
LAB_00322f95:
    uVar5 = io::CodedInputStream::ReadVarint32Fallback(pCVar2,uVar4);
  }
  pCVar2 = this->stream_;
  pbVar3 = pCVar2->buffer_;
  if (pbVar3 < pCVar2->buffer_end_) {
    uVar4 = (uint32)*pbVar3;
    if ((char)*pbVar3 < '\0') goto LAB_00322fc6;
    pCVar2->buffer_ = pbVar3 + 1;
  }
  else {
    uVar4 = 0;
LAB_00322fc6:
    uVar4 = io::CodedInputStream::ReadTagFallback(pCVar2,uVar4);
  }
  pCVar2->last_tag_ = uVar4;
LAB_00322fd8:
  (**(code **)(*(long *)field_name.length_ + 0x40))
            ((long *)field_name.length_,type,field_name.ptr_,uVar5 & 0xffffffff);
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::RenderUInt32(const ProtoStreamObjectSource* os,
                                             const google::protobuf::Type& type,
                                             StringPiece field_name,
                                             ObjectWriter* ow) {
  uint32 tag = os->stream_->ReadTag();
  uint32 buffer32 = 0;  // default value of UInt32 wrapper value
  if (tag != 0) {
    os->stream_->ReadVarint32(&buffer32);
    os->stream_->ReadTag();
  }
  ow->RenderUint32(field_name, bit_cast<uint32>(buffer32));
  return util::Status();
}